

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O1

Abc_Frame_t * Abc_FrameGetGlobalFrame(void)

{
  if (s_GlobalFrame == (Abc_Frame_t *)0x0) {
    s_GlobalFrame = Abc_FrameAllocate();
    Abc_FrameInit(s_GlobalFrame);
  }
  return s_GlobalFrame;
}

Assistant:

Abc_Frame_t * Abc_FrameGetGlobalFrame()
{
	if ( s_GlobalFrame == 0 )
	{
		// start the framework
		s_GlobalFrame = Abc_FrameAllocate();
		// perform initializations
		Abc_FrameInit( s_GlobalFrame );
	}
	return s_GlobalFrame;
}